

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *plits;
  Bmc_EsPar_t *pBVar2;
  int nlits;
  int iVar3;
  int (*paiVar4) [32];
  long lVar5;
  long lVar6;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  plits = (int *)malloc(400);
  p_00->pArray = plits;
  iVar1 = p->pPars->nVars;
  lVar6 = (long)iVar1;
  iVar3 = 0;
  nlits = 0;
  if (iVar1 < p->nObjs) {
    paiVar4 = p->pFanins + lVar6;
    do {
      iVar1 = Zyx_ManCollectFanins(p,(int)lVar6);
      pBVar2 = p->pPars;
      if (iVar1 != pBVar2->nLutSize) {
        __assert_fail("nFanins == p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x3e0,"int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *)");
      }
      if (0 < iVar1) {
        lVar5 = 0;
        do {
          iVar1 = p->TopoBase + (*paiVar4)[lVar5] + ((int)lVar6 - pBVar2->nVars) * p->nObjs;
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p_00,iVar1 * 2 + 1);
          lVar5 = lVar5 + 1;
          pBVar2 = p->pPars;
        } while (lVar5 < pBVar2->nLutSize);
      }
      lVar6 = lVar6 + 1;
      paiVar4 = paiVar4 + 1;
    } while (lVar6 < p->nObjs);
    plits = p_00->pArray;
    nlits = p_00->nSize;
  }
  iVar1 = bmcg_sat_solver_addclause(p->pSat,plits,nlits);
  if (iVar1 != 0) {
    if (plits != (int *)0x0) {
      free(plits);
    }
    free(p_00);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Zyx_ManAddCnfBlockSolution( Zyx_Man_t * p )
{
    Vec_Int_t * vLits = Vec_IntAlloc( 100 ); int i, k;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        assert( nFanins == p->pPars->nLutSize );
        for ( k = 0; k < p->pPars->nLutSize; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(Zyx_TopoVar(p, i, p->pFanins[i][k]), 1) );
    }
    //Zyx_ManPrintVarMap( p, 1 );
    //Zyx_PrintClause( Vec_IntArray(vLits), Vec_IntSize(vLits) );
    if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
        return 0;
    Vec_IntFree( vLits );
    return 1;
}